

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  int iVar1;
  ZSTD_cpuid_t cpuid;
  void *ptr;
  ZSTD_CCtx *cctx;
  size_t workspaceSize_local;
  void *workspace_local;
  
  if (workspaceSize < 0x3d9) {
    workspace_local = (void *)0x0;
  }
  else if (((ulong)workspace & 7) == 0) {
    memset(workspace,0,workspaceSize);
    *(size_t *)((long)workspace + 0x1b8) = workspaceSize;
    *(long *)((long)workspace + 0x118) = (long)workspace + 0x3d8;
    *(size_t *)((long)workspace + 0x120) = workspaceSize - 0x3d8;
    if (*(ulong *)((long)workspace + 0x120) < 0x3be0) {
      workspace_local = (void *)0x0;
    }
    else {
      *(undefined8 *)((long)workspace + 0x278) = *(undefined8 *)((long)workspace + 0x118);
      *(long *)((long)workspace + 0x280) = *(long *)((long)workspace + 0x278) + 0x11f0;
      *(long *)((long)workspace + 0x358) = *(long *)((long)workspace + 0x280) + 0x11f0;
      cpuid = ZSTD_cpuid();
      iVar1 = ZSTD_cpuid_bmi2(cpuid);
      *(int *)((long)workspace + 8) = iVar1;
      workspace_local = workspace;
    }
  }
  else {
    workspace_local = (void *)0x0;
  }
  return (ZSTD_CCtx *)workspace_local;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_CCtx* const cctx = (ZSTD_CCtx*) workspace;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    memset(workspace, 0, workspaceSize);   /* may be a bit generous, could memset be smaller ? */
    cctx->staticSize = workspaceSize;
    cctx->workSpace = (void*)(cctx+1);
    cctx->workSpaceSize = workspaceSize - sizeof(ZSTD_CCtx);

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (cctx->workSpaceSize < HUF_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t)) return NULL;
    assert(((size_t)cctx->workSpace & (sizeof(void*)-1)) == 0);   /* ensure correct alignment */
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)cctx->workSpace;
    cctx->blockState.nextCBlock = cctx->blockState.prevCBlock + 1;
    {
        void* const ptr = cctx->blockState.nextCBlock + 1;
        cctx->entropyWorkspace = (U32*)ptr;
    }
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}